

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::CoroutineBase::unhandled_exception(CoroutineBase *this)

{
  bool bVar1;
  DisposalResults *pDVar2;
  ExceptionOrValue *pEVar3;
  Context *pCVar4;
  DisposalResults *disposalResults;
  Exception local_1b8;
  
  getCaughtExceptionAsKj();
  pCVar4 = local_1b8.context.ptr.ptr;
  pDVar2 = (this->maybeDisposalResults).ptr;
  if (pDVar2 == (DisposalResults *)0x0) {
    pEVar3 = this->resultRef;
    bVar1 = (pEVar3->exception).ptr.isSet;
    if (this->waiting == true) {
      if (bVar1 == false) {
        (pEVar3->exception).ptr.field_1.value.ownFile.content.ptr = local_1b8.ownFile.content.ptr;
        (pEVar3->exception).ptr.field_1.value.ownFile.content.size_ =
             local_1b8.ownFile.content.size_;
        (pEVar3->exception).ptr.field_1.value.ownFile.content.disposer =
             local_1b8.ownFile.content.disposer;
        local_1b8.ownFile.content.ptr = (char *)0x0;
        local_1b8.ownFile.content.size_ = 0;
        (pEVar3->exception).ptr.field_1.value.file = local_1b8.file;
        *(undefined8 *)((long)&(pEVar3->exception).ptr.field_1 + 0x20) = local_1b8._32_8_;
        (pEVar3->exception).ptr.field_1.value.description.content.ptr =
             local_1b8.description.content.ptr;
        (pEVar3->exception).ptr.field_1.value.description.content.size_ =
             local_1b8.description.content.size_;
        local_1b8.description.content.ptr = (char *)0x0;
        local_1b8.description.content.size_ = 0;
        (pEVar3->exception).ptr.field_1.value.description.content.disposer =
             local_1b8.description.content.disposer;
        (pEVar3->exception).ptr.field_1.value.context.ptr.disposer = local_1b8.context.ptr.disposer;
        local_1b8.context.ptr.ptr = (Context *)0x0;
        (pEVar3->exception).ptr.field_1.value.context.ptr.ptr = pCVar4;
        (pEVar3->exception).ptr.field_1.value.remoteTrace.content.ptr =
             local_1b8.remoteTrace.content.ptr;
        (pEVar3->exception).ptr.field_1.value.remoteTrace.content.size_ =
             local_1b8.remoteTrace.content.size_;
        (pEVar3->exception).ptr.field_1.value.remoteTrace.content.disposer =
             local_1b8.remoteTrace.content.disposer;
        local_1b8.remoteTrace.content.ptr = (char *)0x0;
        local_1b8.remoteTrace.content.size_ = 0;
        memcpy((void *)((long)&(pEVar3->exception).ptr.field_1 + 0x68),local_1b8.trace,0x105);
        (pEVar3->exception).ptr.field_1.value.details.builder.ptr = local_1b8.details.builder.ptr;
        (pEVar3->exception).ptr.field_1.value.details.builder.pos = local_1b8.details.builder.pos;
        (pEVar3->exception).ptr.field_1.value.details.builder.endPtr =
             local_1b8.details.builder.endPtr;
        (pEVar3->exception).ptr.field_1.value.details.builder.disposer =
             local_1b8.details.builder.disposer;
        local_1b8.details.builder.endPtr = (Detail *)0x0;
        local_1b8.details.builder.ptr = (Detail *)0x0;
        local_1b8.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
        (pEVar3->exception).ptr.isSet = true;
      }
      PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
      this->waiting = false;
    }
    else if (bVar1 == false) {
      (pEVar3->exception).ptr.field_1.value.ownFile.content.ptr = local_1b8.ownFile.content.ptr;
      (pEVar3->exception).ptr.field_1.value.ownFile.content.size_ = local_1b8.ownFile.content.size_;
      (pEVar3->exception).ptr.field_1.value.ownFile.content.disposer =
           local_1b8.ownFile.content.disposer;
      local_1b8.ownFile.content.ptr = (char *)0x0;
      local_1b8.ownFile.content.size_ = 0;
      (pEVar3->exception).ptr.field_1.value.file = local_1b8.file;
      *(undefined8 *)((long)&(pEVar3->exception).ptr.field_1 + 0x20) = local_1b8._32_8_;
      (pEVar3->exception).ptr.field_1.value.description.content.ptr =
           local_1b8.description.content.ptr;
      (pEVar3->exception).ptr.field_1.value.description.content.size_ =
           local_1b8.description.content.size_;
      local_1b8.description.content.ptr = (char *)0x0;
      local_1b8.description.content.size_ = 0;
      (pEVar3->exception).ptr.field_1.value.description.content.disposer =
           local_1b8.description.content.disposer;
      (pEVar3->exception).ptr.field_1.value.context.ptr.disposer = local_1b8.context.ptr.disposer;
      local_1b8.context.ptr.ptr = (Context *)0x0;
      (pEVar3->exception).ptr.field_1.value.context.ptr.ptr = pCVar4;
      (pEVar3->exception).ptr.field_1.value.remoteTrace.content.ptr =
           local_1b8.remoteTrace.content.ptr;
      (pEVar3->exception).ptr.field_1.value.remoteTrace.content.size_ =
           local_1b8.remoteTrace.content.size_;
      (pEVar3->exception).ptr.field_1.value.remoteTrace.content.disposer =
           local_1b8.remoteTrace.content.disposer;
      local_1b8.remoteTrace.content.ptr = (char *)0x0;
      local_1b8.remoteTrace.content.size_ = 0;
      memcpy((void *)((long)&(pEVar3->exception).ptr.field_1 + 0x68),local_1b8.trace,0x105);
      (pEVar3->exception).ptr.field_1.value.details.builder.ptr = local_1b8.details.builder.ptr;
      (pEVar3->exception).ptr.field_1.value.details.builder.pos = local_1b8.details.builder.pos;
      (pEVar3->exception).ptr.field_1.value.details.builder.endPtr =
           local_1b8.details.builder.endPtr;
      (pEVar3->exception).ptr.field_1.value.details.builder.disposer =
           local_1b8.details.builder.disposer;
      local_1b8.details.builder.endPtr = (Detail *)0x0;
      local_1b8.details.builder.ptr = (Detail *)0x0;
      local_1b8.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
      (pEVar3->exception).ptr.isSet = true;
    }
  }
  else if ((pDVar2->exception).ptr.isSet == false) {
    (pDVar2->exception).ptr.field_1.value.ownFile.content.ptr = local_1b8.ownFile.content.ptr;
    (pDVar2->exception).ptr.field_1.value.ownFile.content.size_ = local_1b8.ownFile.content.size_;
    (pDVar2->exception).ptr.field_1.value.ownFile.content.disposer =
         local_1b8.ownFile.content.disposer;
    local_1b8.ownFile.content.ptr = (char *)0x0;
    local_1b8.ownFile.content.size_ = 0;
    (pDVar2->exception).ptr.field_1.value.file = local_1b8.file;
    *(undefined8 *)((long)&(pDVar2->exception).ptr.field_1 + 0x20) = local_1b8._32_8_;
    (pDVar2->exception).ptr.field_1.value.description.content.ptr =
         local_1b8.description.content.ptr;
    (pDVar2->exception).ptr.field_1.value.description.content.size_ =
         local_1b8.description.content.size_;
    local_1b8.description.content.ptr = (char *)0x0;
    local_1b8.description.content.size_ = 0;
    (pDVar2->exception).ptr.field_1.value.description.content.disposer =
         local_1b8.description.content.disposer;
    (pDVar2->exception).ptr.field_1.value.context.ptr.disposer = local_1b8.context.ptr.disposer;
    local_1b8.context.ptr.ptr = (Context *)0x0;
    (pDVar2->exception).ptr.field_1.value.context.ptr.ptr = pCVar4;
    (pDVar2->exception).ptr.field_1.value.remoteTrace.content.ptr =
         local_1b8.remoteTrace.content.ptr;
    (pDVar2->exception).ptr.field_1.value.remoteTrace.content.size_ =
         local_1b8.remoteTrace.content.size_;
    (pDVar2->exception).ptr.field_1.value.remoteTrace.content.disposer =
         local_1b8.remoteTrace.content.disposer;
    local_1b8.remoteTrace.content.ptr = (char *)0x0;
    local_1b8.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&(pDVar2->exception).ptr.field_1 + 0x68),local_1b8.trace,0x105);
    (pDVar2->exception).ptr.field_1.value.details.builder.ptr = local_1b8.details.builder.ptr;
    (pDVar2->exception).ptr.field_1.value.details.builder.pos = local_1b8.details.builder.pos;
    (pDVar2->exception).ptr.field_1.value.details.builder.endPtr = local_1b8.details.builder.endPtr;
    (pDVar2->exception).ptr.field_1.value.details.builder.disposer =
         local_1b8.details.builder.disposer;
    local_1b8.details.builder.endPtr = (Detail *)0x0;
    local_1b8.details.builder.ptr = (Detail *)0x0;
    local_1b8.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    (pDVar2->exception).ptr.isSet = true;
  }
  Exception::~Exception(&local_1b8);
  return;
}

Assistant:

void CoroutineBase::unhandled_exception() {
  // Pretty self-explanatory, we propagate the exception to the promise which owns us, unless
  // we're being destroyed, in which case we propagate it back to our disposer. Note that all
  // unhandled exceptions end up here, not just ones after the first co_await.

  auto exception = getCaughtExceptionAsKj();

  KJ_IF_SOME(disposalResults, maybeDisposalResults) {
    // Exception during coroutine destruction. Only record the first one.
    if (disposalResults.exception == kj::none) {
      disposalResults.exception = kj::mv(exception);
    }
  } else if (isWaiting()) {
    // Exception during coroutine execution.
    resultRef.addException(kj::mv(exception));
    scheduleResumption();
  } else {
    // Okay, what could this mean? We've already been fulfilled or rejected, but we aren't being
    // destroyed yet. The only possibility is that we are unwinding the coroutine frame due to a
    // successful completion, and something in the frame threw. We can't already be rejected,
    // because rejecting a coroutine involves throwing, which would have unwound the frame prior
    // to setting `waiting = false`.
    //
    // Since we know we're unwinding due to a successful completion, we also know that whatever
    // Event we may have armed has not yet fired, because we haven't had a chance to return to
    // the event loop.

    // final_suspend() has not been called.
#if _MSC_VER && !defined(__clang__)
    // See comment at `finalSuspendCalled`'s definition.
    KJ_IASSERT(!finalSuspendCalled);
#else
    KJ_IASSERT(!coroutine.done());
#endif

    // Since final_suspend() hasn't been called, whatever Event is waiting on us has not fired,
    // and will see this exception.
    resultRef.addException(kj::mv(exception));
  }